

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

Value * __thiscall
cmFileAPI::BuildObject(Value *__return_storage_ptr__,cmFileAPI *this,Object *object)

{
  cmFileAPI *this_00;
  Value *__return_storage_ptr___00;
  Value local_c0;
  Value local_98;
  Value local_70;
  Value local_48;
  
  this_00 = (cmFileAPI *)0x0;
  Json::Value::Value(__return_storage_ptr__,nullValue);
  switch(object->Kind) {
  case CodeModel:
    __return_storage_ptr___00 = &local_48;
    BuildCodeModel(__return_storage_ptr___00,this,object);
    Json::Value::operator=(__return_storage_ptr__,__return_storage_ptr___00);
    break;
  case Cache:
    __return_storage_ptr___00 = &local_70;
    BuildCache(__return_storage_ptr___00,this,object);
    Json::Value::operator=(__return_storage_ptr__,__return_storage_ptr___00);
    break;
  case CMakeFiles:
    __return_storage_ptr___00 = &local_98;
    BuildCMakeFiles(__return_storage_ptr___00,this,object);
    Json::Value::operator=(__return_storage_ptr__,__return_storage_ptr___00);
    break;
  case InternalTest:
    __return_storage_ptr___00 = &local_c0;
    BuildInternalTest(__return_storage_ptr___00,this_00,object);
    Json::Value::operator=(__return_storage_ptr__,__return_storage_ptr___00);
    break;
  default:
    goto switchD_002960fd_default;
  }
  Json::Value::~Value(__return_storage_ptr___00);
switchD_002960fd_default:
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildObject(Object const& object)
{
  Json::Value value;

  switch (object.Kind) {
    case ObjectKind::CodeModel:
      value = this->BuildCodeModel(object);
      break;
    case ObjectKind::Cache:
      value = this->BuildCache(object);
      break;
    case ObjectKind::CMakeFiles:
      value = this->BuildCMakeFiles(object);
      break;
    case ObjectKind::InternalTest:
      value = this->BuildInternalTest(object);
      break;
  }

  return value;
}